

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mocks.c
# Opt level: O0

Constraint * times_(int number_times_called)

{
  Constraint *string;
  char *pcVar1;
  int in_EDI;
  Constraint *time_constraint;
  CgreenValue local_28;
  Constraint *local_10;
  int local_4;
  
  local_4 = in_EDI;
  string = create_constraint();
  local_10 = string;
  make_cgreen_integer_value(&local_28,(long)local_4);
  (string->expected_value).type = local_28.type;
  *(undefined4 *)&(string->expected_value).field_0x4 = local_28._4_4_;
  (string->expected_value).value = local_28.value;
  (string->expected_value).value_size = local_28.value_size;
  pcVar1 = string_dup((char *)string);
  local_10->expected_value_name = pcVar1;
  local_10->type = CGREEN_CALL_COUNTER_CONSTRAINT;
  local_10->compare = compare_want_value;
  local_10->execute = test_times_called;
  local_10->name = "be called";
  local_10->size_of_expected_value = 8;
  local_10->expected_value_message = "\t\texpected to have been called:\t[%ld] times";
  return local_10;
}

Assistant:

Constraint *times_(const int number_times_called) {
    Constraint * time_constraint = create_constraint();
    time_constraint->expected_value = make_cgreen_integer_value(number_times_called);
    time_constraint->expected_value_name = string_dup("times");
    time_constraint->type = CGREEN_CALL_COUNTER_CONSTRAINT;

    time_constraint->compare = &compare_want_value;
    time_constraint->execute = &test_times_called;
    time_constraint->name = "be called";
    time_constraint->size_of_expected_value = sizeof(intptr_t);
    time_constraint->expected_value_message = "\t\texpected to have been called:\t[%" PRIdPTR "] times";
    return time_constraint;
}